

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

wchar_t scp_send_filetimes(unsigned_long mtime,unsigned_long atime)

{
  Backend *pBVar1;
  wchar_t wVar2;
  size_t sVar3;
  char buf [80];
  char acStack_68 [88];
  
  if (using_sftp) {
    scp_sftp_mtime = mtime;
    scp_sftp_atime = atime;
    scp_has_times = 1;
    return L'\0';
  }
  sprintf(acStack_68,"T%lu 0 %lu 0\n");
  pBVar1 = backend;
  sVar3 = strlen(acStack_68);
  (*pBVar1->vt->send)(pBVar1,acStack_68,sVar3);
  wVar2 = response();
  return wVar2;
}

Assistant:

int scp_send_filetimes(unsigned long mtime, unsigned long atime)
{
    if (using_sftp) {
        scp_sftp_mtime = mtime;
        scp_sftp_atime = atime;
        scp_has_times = true;
        return 0;
    } else {
        char buf[80];
        sprintf(buf, "T%lu 0 %lu 0\n", mtime, atime);
        backend_send(backend, buf, strlen(buf));
        return response();
    }
}